

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O2

void __thiscall
ConfidentialValue_Constractor_bytedata_err_Test::TestBody
          (ConfidentialValue_Constractor_bytedata_err_Test *this)

{
  bool bVar1;
  allocator local_71;
  string local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  ConfidentialValue value;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,"001122",&local_71);
    cfd::core::ByteData::ByteData((ByteData *)&local_50,&local_70);
    cfd::core::ConfidentialValue::ConfidentialValue(&value,(ByteData *)&local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    cfd::core::ConfidentialValue::~ConfidentialValue(&value);
  }
  testing::Message::Message((Message *)&value);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
             ,0x8d,
             "Expected: ConfidentialValue value(ByteData(\"001122\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&value);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&value);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_bytedata_err) {
  // error
  EXPECT_THROW(ConfidentialValue value(ByteData("001122")), CfdException);
}